

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator<<(long lhs,
          SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits)

{
  int iVar1;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  long local_20;
  long local_18;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_8;
  
  local_18 = in_RDI;
  iVar1 = SafeInt::operator_cast_to_int
                    ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar1 < 0) {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b09,
                  "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = int, U = long, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  iVar1 = SafeInt::operator_cast_to_int
                    ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar1 < 0x40) {
    iVar1 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_20 = local_18 << ((byte)iVar1 & 0x3f);
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_8,&local_20);
    return (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
           local_8.m_int;
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b0a,
                "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = int, U = long, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator <<( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs << (T)bits ) );
}